

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O3

void __thiscall Fl_Widget_Class_Type::write_code2(Fl_Widget_Class_Type *this)

{
  Fl_Widget *pFVar1;
  char *pcVar2;
  char *pcVar3;
  
  Fl_Widget_Type::write_extra_code((Fl_Widget_Type *)this);
  if (this->wc_relative != '\0') {
    pcVar2 = indent();
    write_c("%sposition(X, Y);\n",pcVar2);
  }
  if ((this->super_Fl_Window_Type).modal == '\0') {
    if ((this->super_Fl_Window_Type).non_modal == '\0') goto LAB_0018edd5;
    pcVar2 = "%sset_non_modal();\n";
  }
  else {
    pcVar2 = "%sset_modal();\n";
  }
  pcVar3 = indent();
  write_c(pcVar2,pcVar3);
LAB_0018edd5:
  if ((((this->super_Fl_Window_Type).super_Fl_Widget_Type.o)->flags_ & 8) != 0) {
    pcVar2 = indent();
    write_c("%sclear_border();\n",pcVar2);
  }
  if ((this->super_Fl_Window_Type).super_Fl_Widget_Type.xclass != (char *)0x0) {
    pcVar2 = indent();
    write_c("%sxclass(",pcVar2);
    write_cstring((this->super_Fl_Window_Type).super_Fl_Widget_Type.xclass);
    write_c(");\n");
  }
  pcVar2 = indent();
  write_c("%send();\n",pcVar2);
  pFVar1 = (this->super_Fl_Window_Type).super_Fl_Widget_Type.o;
  if ((Fl_Widget *)pFVar1[1].callback_ == pFVar1) {
    pcVar2 = indent();
    write_c("%sresizable(this);\n",pcVar2);
  }
  write_c("}\n");
  return;
}

Assistant:

void Fl_Widget_Class_Type::write_code2() {
  write_extra_code();
  if (wc_relative) write_c("%sposition(X, Y);\n", indent());
  if (modal) write_c("%sset_modal();\n", indent());
  else if (non_modal) write_c("%sset_non_modal();\n", indent());
  if (!((Fl_Window*)o)->border()) write_c("%sclear_border();\n", indent());
  if (xclass) {
    write_c("%sxclass(", indent());
    write_cstring(xclass);
    write_c(");\n");
  }
  write_c("%send();\n", indent());
  if (((Fl_Window*)o)->resizable() == o)
    write_c("%sresizable(this);\n", indent());
  write_c("}\n");
}